

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

FT_Pos af_hint_normal_stem(AF_GlyphHints hints,AF_Edge_conflict edge,AF_Edge_conflict edge2,
                          FT_Pos anchor,AF_Dimension dim)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long local_b0;
  long local_a0;
  ulong local_90;
  FT_Pos threshold;
  FT_Pos offset;
  FT_Pos delta;
  FT_Pos u_off2;
  FT_Pos d_off2;
  FT_Pos u_off1;
  FT_Pos d_off1;
  FT_Pos cur_pos2;
  FT_Pos cur_pos1;
  FT_Pos org_center;
  FT_Pos cur_len;
  FT_Pos org_len;
  AF_Dimension dim_local;
  FT_Pos anchor_local;
  AF_Edge_conflict edge2_local;
  AF_Edge_conflict edge_local;
  AF_GlyphHints hints_local;
  
  local_90 = 0x40;
  if ((hints->other_flags & 4) == 0) {
    if (((edge->flags & 1) == 0) || ((edge2->flags & 1) == 0)) {
      if (dim == AF_DIMENSION_VERT) {
        local_90 = 0x3d;
      }
      else {
        local_90 = 0x3b;
      }
    }
    else if (dim == AF_DIMENSION_VERT) {
      local_90 = 0x37;
    }
    else {
      local_90 = 0x31;
    }
  }
  uVar1 = af_cjk_compute_stem_width
                    (hints,dim,edge2->opos - edge->opos,(uint)edge->flags,(uint)edge2->flags);
  uVar2 = ((edge->opos + edge2->opos) / 2 + anchor) - (long)uVar1 / 2;
  lVar3 = uVar2 - (uVar2 & 0xffffffffffffffc0);
  lVar4 = (uVar2 + uVar1) - (uVar2 + uVar1 & 0xffffffffffffffc0);
  lVar5 = 0x40 - lVar3;
  offset = 0;
  if ((lVar3 != 0) && (lVar4 != 0)) {
    if ((long)local_90 < (long)uVar1) {
      if ((0x3f < local_90) ||
         ((((lVar3 < (long)local_90 && (lVar5 < (long)local_90)) && (lVar4 < (long)local_90)) &&
          (0x40 - lVar4 < (long)local_90)))) {
        threshold = uVar1 & 0x3f;
        if ((ulong)threshold < 0x20) {
          if ((lVar5 <= threshold) || (lVar4 <= threshold)) goto LAB_001ca5de;
        }
        else {
          threshold = 0x40 - local_90;
        }
        d_off2 = lVar5 - threshold;
        delta = local_90 - lVar4;
        if ((long)(local_90 - lVar5) <= d_off2) {
          d_off2 = -(local_90 - lVar5);
        }
        if (lVar4 - threshold <= delta) {
          delta = -(lVar4 - threshold);
        }
        if (d_off2 < 0) {
          local_a0 = -d_off2;
        }
        else {
          local_a0 = d_off2;
        }
        if (delta < 0) {
          local_b0 = -delta;
        }
        else {
          local_b0 = delta;
        }
        if (local_b0 < local_a0) {
          offset = delta;
        }
        else {
          offset = d_off2;
        }
      }
    }
    else if ((lVar4 < (long)uVar1) && (offset = lVar5, lVar4 < lVar5)) {
      offset = -lVar4;
    }
  }
LAB_001ca5de:
  if ((hints->other_flags & 4) == 0) {
    if (offset < 0xf) {
      if (offset < -0xe) {
        offset = -0xe;
      }
    }
    else {
      offset = 0xe;
    }
  }
  lVar3 = offset + uVar2;
  if (edge->opos < edge2->opos) {
    edge->pos = lVar3;
    edge2->pos = lVar3 + uVar1;
  }
  else {
    edge->pos = lVar3 + uVar1;
    edge2->pos = lVar3;
  }
  return offset;
}

Assistant:

static FT_Pos
  af_hint_normal_stem( AF_GlyphHints  hints,
                       AF_Edge        edge,
                       AF_Edge        edge2,
                       FT_Pos         anchor,
                       AF_Dimension   dim )
  {
    FT_Pos  org_len, cur_len, org_center;
    FT_Pos  cur_pos1, cur_pos2;
    FT_Pos  d_off1, u_off1, d_off2, u_off2, delta;
    FT_Pos  offset;
    FT_Pos  threshold = 64;


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
    {
      if ( ( edge->flags  & AF_EDGE_ROUND ) &&
           ( edge2->flags & AF_EDGE_ROUND ) )
      {
        if ( dim == AF_DIMENSION_VERT )
          threshold = 64 - AF_LIGHT_MODE_MAX_HORZ_GAP;
        else
          threshold = 64 - AF_LIGHT_MODE_MAX_VERT_GAP;
      }
      else
      {
        if ( dim == AF_DIMENSION_VERT )
          threshold = 64 - AF_LIGHT_MODE_MAX_HORZ_GAP / 3;
        else
          threshold = 64 - AF_LIGHT_MODE_MAX_VERT_GAP / 3;
      }
    }

    org_len    = edge2->opos - edge->opos;
    cur_len    = af_cjk_compute_stem_width( hints, dim, org_len,
                                            edge->flags,
                                            edge2->flags );

    org_center = ( edge->opos + edge2->opos ) / 2 + anchor;
    cur_pos1   = org_center - cur_len / 2;
    cur_pos2   = cur_pos1 + cur_len;
    d_off1     = cur_pos1 - FT_PIX_FLOOR( cur_pos1 );
    d_off2     = cur_pos2 - FT_PIX_FLOOR( cur_pos2 );
    u_off1     = 64 - d_off1;
    u_off2     = 64 - d_off2;
    delta      = 0;


    if ( d_off1 == 0 || d_off2 == 0 )
      goto Exit;

    if ( cur_len <= threshold )
    {
      if ( d_off2 < cur_len )
      {
        if ( u_off1 <= d_off2 )
          delta =  u_off1;
        else
          delta = -d_off2;
      }

      goto Exit;
    }

    if ( threshold < 64 )
    {
      if ( d_off1 >= threshold || u_off1 >= threshold ||
           d_off2 >= threshold || u_off2 >= threshold )
        goto Exit;
    }

    offset = cur_len & 63;

    if ( offset < 32 )
    {
      if ( u_off1 <= offset || d_off2 <= offset )
        goto Exit;
    }
    else
      offset = 64 - threshold;

    d_off1 = threshold - u_off1;
    u_off1 = u_off1    - offset;
    u_off2 = threshold - d_off2;
    d_off2 = d_off2    - offset;

    if ( d_off1 <= u_off1 )
      u_off1 = -d_off1;

    if ( d_off2 <= u_off2 )
      u_off2 = -d_off2;

    if ( FT_ABS( u_off1 ) <= FT_ABS( u_off2 ) )
      delta = u_off1;
    else
      delta = u_off2;

  Exit:

#if 1
    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
    {
      if ( delta > AF_LIGHT_MODE_MAX_DELTA_ABS )
        delta = AF_LIGHT_MODE_MAX_DELTA_ABS;
      else if ( delta < -AF_LIGHT_MODE_MAX_DELTA_ABS )
        delta = -AF_LIGHT_MODE_MAX_DELTA_ABS;
    }
#endif

    cur_pos1 += delta;

    if ( edge->opos < edge2->opos )
    {
      edge->pos  = cur_pos1;
      edge2->pos = cur_pos1 + cur_len;
    }
    else
    {
      edge->pos  = cur_pos1 + cur_len;
      edge2->pos = cur_pos1;
    }

    return delta;
  }